

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_setup.h
# Opt level: O0

void SetupStyleFromHue(void)

{
  ImVec4 *this;
  float *out_h;
  ImGuiStyle *pIVar1;
  ImVec4 IVar2;
  ImVec4 IVar3;
  ImVec4 IVar4;
  ImVec4 local_348;
  ImVec4 local_338;
  ImVec4 local_328;
  ImVec4 local_318;
  ImVec4 local_308;
  ImVec4 local_2f8;
  ImVec4 local_2e8;
  ImVec4 local_2d8;
  ImVec4 local_2c8;
  ImVec4 local_2b8;
  ImVec4 local_2a8;
  ImVec4 local_298;
  ImVec4 local_288;
  ImVec4 local_278;
  ImVec4 local_268;
  ImVec4 local_258;
  ImVec4 local_248;
  ImVec4 local_238;
  ImVec4 local_228;
  ImVec4 local_218;
  ImVec4 local_208;
  ImVec4 local_1f8;
  ImVec4 local_1e8;
  ImVec4 local_1d8;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec4 local_1a8;
  ImVec4 local_198;
  ImVec4 local_188;
  ImVec4 local_178;
  ImVec4 local_168;
  ImVec4 local_158;
  ImVec4 local_148;
  ImVec4 local_138;
  ImVec4 local_128;
  ImVec4 local_118;
  ImVec4 local_108;
  ImVec4 local_f8;
  ImVec4 local_e8;
  ImVec4 local_d8;
  ImVec4 local_c8;
  ImVec4 local_b8;
  ImVec4 local_a8;
  undefined1 local_98 [8];
  ImVec4 col_area;
  float local_78;
  float fStack_74;
  ImVec4 col_back;
  float local_58;
  float fStack_54;
  ImVec4 col_main;
  float local_38;
  float fStack_34;
  ImVec4 col_text;
  ImGuiStyle *style;
  float local_18;
  ImVec4 rgb;
  float dummy;
  
  ImGui::Begin("Hue Style",(bool *)0x0,0);
  ImGui::SliderInt("master hue",&SetupStyleFromHue::hue,0,0xff,"%.0f");
  this = (ImVec4 *)((long)&style + 4);
  ImVec4::ImVec4(this);
  ImGui::ColorEditMode(1);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_main_sat,
             SetupStyleFromHue::col_main_val,(float *)this,&local_18,&rgb.x);
  ImGui::ColorEdit3("main",(float *)this);
  out_h = &rgb.z;
  ImGui::ColorConvertRGBtoHSV
            (style._4_4_,local_18,rgb.x,out_h,&SetupStyleFromHue::col_main_sat,
             &SetupStyleFromHue::col_main_val);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_area_sat,
             SetupStyleFromHue::col_area_val,(float *)this,&local_18,&rgb.x);
  ImGui::ColorEdit3("area",(float *)this);
  ImGui::ColorConvertRGBtoHSV
            (style._4_4_,local_18,rgb.x,out_h,&SetupStyleFromHue::col_area_sat,
             &SetupStyleFromHue::col_area_val);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_back_sat,
             SetupStyleFromHue::col_back_val,(float *)this,&local_18,&rgb.x);
  ImGui::ColorEdit3("back",(float *)this);
  ImGui::ColorConvertRGBtoHSV
            (style._4_4_,local_18,rgb.x,out_h,&SetupStyleFromHue::col_back_sat,
             &SetupStyleFromHue::col_back_val);
  ImGui::End();
  pIVar1 = ImGui::GetStyle();
  join_0x00001240_0x00001200_ =
       (ImVec4)ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,0.078431375,0.92156863,1.0);
  IVar2 = ImColor::operator_cast_to_ImVec4((ImColor *)&col_main.z);
  join_0x00001240_0x00001200_ =
       (ImVec4)ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_main_sat,
                            SetupStyleFromHue::col_main_val,1.0);
  IVar3 = ImColor::operator_cast_to_ImVec4((ImColor *)&col_back.z);
  col_main._0_8_ = IVar3._8_8_;
  join_0x00001240_0x00001200_ =
       (ImVec4)ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_back_sat,
                            SetupStyleFromHue::col_back_val,1.0);
  IVar4 = ImColor::operator_cast_to_ImVec4((ImColor *)&col_area.z);
  col_back._0_8_ = IVar4._8_8_;
  local_a8 = (ImVec4)ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,
                                  SetupStyleFromHue::col_area_sat,SetupStyleFromHue::col_area_val,
                                  1.0);
  _local_98 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_a8);
  local_38 = IVar2.x;
  fStack_34 = IVar2.y;
  col_text.x = IVar2.z;
  ImVec4::ImVec4(&local_b8,local_38,fStack_34,col_text.x,1.0);
  pIVar1->Colors[0].x = local_b8.x;
  pIVar1->Colors[0].y = local_b8.y;
  pIVar1->Colors[0].z = local_b8.z;
  pIVar1->Colors[0].w = local_b8.w;
  ImVec4::ImVec4(&local_c8,local_38,fStack_34,col_text.x,0.58);
  pIVar1->Colors[1].x = local_c8.x;
  pIVar1->Colors[1].y = local_c8.y;
  pIVar1->Colors[1].z = local_c8.z;
  pIVar1->Colors[1].w = local_c8.w;
  local_78 = IVar4.x;
  fStack_74 = IVar4.y;
  ImVec4::ImVec4(&local_d8,local_78,fStack_74,col_back.x,1.0);
  pIVar1->Colors[2].x = local_d8.x;
  pIVar1->Colors[2].y = local_d8.y;
  pIVar1->Colors[2].z = local_d8.z;
  pIVar1->Colors[2].w = local_d8.w;
  ImVec4::ImVec4(&local_e8,(float)local_98._0_4_,(float)local_98._4_4_,col_area.x,0.0);
  pIVar1->Colors[3].x = local_e8.x;
  pIVar1->Colors[3].y = local_e8.y;
  pIVar1->Colors[3].z = local_e8.z;
  pIVar1->Colors[3].w = local_e8.w;
  ImVec4::ImVec4(&local_f8,local_38,fStack_34,col_text.x,0.3);
  pIVar1->Colors[5].x = local_f8.x;
  pIVar1->Colors[5].y = local_f8.y;
  pIVar1->Colors[5].z = local_f8.z;
  pIVar1->Colors[5].w = local_f8.w;
  ImVec4::ImVec4(&local_108,0.0,0.0,0.0,0.0);
  pIVar1->Colors[6].x = local_108.x;
  pIVar1->Colors[6].y = local_108.y;
  pIVar1->Colors[6].z = local_108.z;
  pIVar1->Colors[6].w = local_108.w;
  ImVec4::ImVec4(&local_118,(float)local_98._0_4_,(float)local_98._4_4_,col_area.x,1.0);
  pIVar1->Colors[7].x = local_118.x;
  pIVar1->Colors[7].y = local_118.y;
  pIVar1->Colors[7].z = local_118.z;
  pIVar1->Colors[7].w = local_118.w;
  local_58 = IVar3.x;
  fStack_54 = IVar3.y;
  ImVec4::ImVec4(&local_128,local_58,fStack_54,col_main.x,0.68);
  pIVar1->Colors[8].x = local_128.x;
  pIVar1->Colors[8].y = local_128.y;
  pIVar1->Colors[8].z = local_128.z;
  pIVar1->Colors[8].w = local_128.w;
  ImVec4::ImVec4(&local_138,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[9].x = local_138.x;
  pIVar1->Colors[9].y = local_138.y;
  pIVar1->Colors[9].z = local_138.z;
  pIVar1->Colors[9].w = local_138.w;
  ImVec4::ImVec4(&local_148,local_58,fStack_54,col_main.x,0.45);
  pIVar1->Colors[10].x = local_148.x;
  pIVar1->Colors[10].y = local_148.y;
  pIVar1->Colors[10].z = local_148.z;
  pIVar1->Colors[10].w = local_148.w;
  ImVec4::ImVec4(&local_158,local_58,fStack_54,col_main.x,0.35);
  pIVar1->Colors[0xb].x = local_158.x;
  pIVar1->Colors[0xb].y = local_158.y;
  pIVar1->Colors[0xb].z = local_158.z;
  pIVar1->Colors[0xb].w = local_158.w;
  ImVec4::ImVec4(&local_168,local_58,fStack_54,col_main.x,0.78);
  pIVar1->Colors[0xc].x = local_168.x;
  pIVar1->Colors[0xc].y = local_168.y;
  pIVar1->Colors[0xc].z = local_168.z;
  pIVar1->Colors[0xc].w = local_168.w;
  ImVec4::ImVec4(&local_178,(float)local_98._0_4_,(float)local_98._4_4_,col_area.x,0.57);
  pIVar1->Colors[0xd].x = local_178.x;
  pIVar1->Colors[0xd].y = local_178.y;
  pIVar1->Colors[0xd].z = local_178.z;
  pIVar1->Colors[0xd].w = local_178.w;
  ImVec4::ImVec4(&local_188,(float)local_98._0_4_,(float)local_98._4_4_,col_area.x,1.0);
  pIVar1->Colors[0xe].x = local_188.x;
  pIVar1->Colors[0xe].y = local_188.y;
  pIVar1->Colors[0xe].z = local_188.z;
  pIVar1->Colors[0xe].w = local_188.w;
  ImVec4::ImVec4(&local_198,local_58,fStack_54,col_main.x,0.31);
  pIVar1->Colors[0xf].x = local_198.x;
  pIVar1->Colors[0xf].y = local_198.y;
  pIVar1->Colors[0xf].z = local_198.z;
  pIVar1->Colors[0xf].w = local_198.w;
  ImVec4::ImVec4(&local_1a8,local_58,fStack_54,col_main.x,0.78);
  pIVar1->Colors[0x10].x = local_1a8.x;
  pIVar1->Colors[0x10].y = local_1a8.y;
  pIVar1->Colors[0x10].z = local_1a8.z;
  pIVar1->Colors[0x10].w = local_1a8.w;
  ImVec4::ImVec4(&local_1b8,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x11].x = local_1b8.x;
  pIVar1->Colors[0x11].y = local_1b8.y;
  pIVar1->Colors[0x11].z = local_1b8.z;
  pIVar1->Colors[0x11].w = local_1b8.w;
  ImVec4::ImVec4(&local_1c8,(float)local_98._0_4_,(float)local_98._4_4_,col_area.x,1.0);
  pIVar1->Colors[0x12].x = local_1c8.x;
  pIVar1->Colors[0x12].y = local_1c8.y;
  pIVar1->Colors[0x12].z = local_1c8.z;
  pIVar1->Colors[0x12].w = local_1c8.w;
  ImVec4::ImVec4(&local_1d8,local_58,fStack_54,col_main.x,0.8);
  pIVar1->Colors[0x13].x = local_1d8.x;
  pIVar1->Colors[0x13].y = local_1d8.y;
  pIVar1->Colors[0x13].z = local_1d8.z;
  pIVar1->Colors[0x13].w = local_1d8.w;
  ImVec4::ImVec4(&local_1e8,local_58,fStack_54,col_main.x,0.24);
  pIVar1->Colors[0x14].x = local_1e8.x;
  pIVar1->Colors[0x14].y = local_1e8.y;
  pIVar1->Colors[0x14].z = local_1e8.z;
  pIVar1->Colors[0x14].w = local_1e8.w;
  ImVec4::ImVec4(&local_1f8,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x15].x = local_1f8.x;
  pIVar1->Colors[0x15].y = local_1f8.y;
  pIVar1->Colors[0x15].z = local_1f8.z;
  pIVar1->Colors[0x15].w = local_1f8.w;
  ImVec4::ImVec4(&local_208,local_58,fStack_54,col_main.x,0.44);
  pIVar1->Colors[0x16].x = local_208.x;
  pIVar1->Colors[0x16].y = local_208.y;
  pIVar1->Colors[0x16].z = local_208.z;
  pIVar1->Colors[0x16].w = local_208.w;
  ImVec4::ImVec4(&local_218,local_58,fStack_54,col_main.x,0.86);
  pIVar1->Colors[0x17].x = local_218.x;
  pIVar1->Colors[0x17].y = local_218.y;
  pIVar1->Colors[0x17].z = local_218.z;
  pIVar1->Colors[0x17].w = local_218.w;
  ImVec4::ImVec4(&local_228,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x18].x = local_228.x;
  pIVar1->Colors[0x18].y = local_228.y;
  pIVar1->Colors[0x18].z = local_228.z;
  pIVar1->Colors[0x18].w = local_228.w;
  ImVec4::ImVec4(&local_238,local_58,fStack_54,col_main.x,0.76);
  pIVar1->Colors[0x19].x = local_238.x;
  pIVar1->Colors[0x19].y = local_238.y;
  pIVar1->Colors[0x19].z = local_238.z;
  pIVar1->Colors[0x19].w = local_238.w;
  ImVec4::ImVec4(&local_248,local_58,fStack_54,col_main.x,0.86);
  pIVar1->Colors[0x1a].x = local_248.x;
  pIVar1->Colors[0x1a].y = local_248.y;
  pIVar1->Colors[0x1a].z = local_248.z;
  pIVar1->Colors[0x1a].w = local_248.w;
  ImVec4::ImVec4(&local_258,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x1b].x = local_258.x;
  pIVar1->Colors[0x1b].y = local_258.y;
  pIVar1->Colors[0x1b].z = local_258.z;
  pIVar1->Colors[0x1b].w = local_258.w;
  ImVec4::ImVec4(&local_268,local_38,fStack_34,col_text.x,0.32);
  pIVar1->Colors[0x1c].x = local_268.x;
  pIVar1->Colors[0x1c].y = local_268.y;
  pIVar1->Colors[0x1c].z = local_268.z;
  pIVar1->Colors[0x1c].w = local_268.w;
  ImVec4::ImVec4(&local_278,local_38,fStack_34,col_text.x,0.78);
  pIVar1->Colors[0x1d].x = local_278.x;
  pIVar1->Colors[0x1d].y = local_278.y;
  pIVar1->Colors[0x1d].z = local_278.z;
  pIVar1->Colors[0x1d].w = local_278.w;
  ImVec4::ImVec4(&local_288,local_38,fStack_34,col_text.x,1.0);
  pIVar1->Colors[0x1e].x = local_288.x;
  pIVar1->Colors[0x1e].y = local_288.y;
  pIVar1->Colors[0x1e].z = local_288.z;
  pIVar1->Colors[0x1e].w = local_288.w;
  ImVec4::ImVec4(&local_298,local_58,fStack_54,col_main.x,0.2);
  pIVar1->Colors[0x1f].x = local_298.x;
  pIVar1->Colors[0x1f].y = local_298.y;
  pIVar1->Colors[0x1f].z = local_298.z;
  pIVar1->Colors[0x1f].w = local_298.w;
  ImVec4::ImVec4(&local_2a8,local_58,fStack_54,col_main.x,0.78);
  pIVar1->Colors[0x20].x = local_2a8.x;
  pIVar1->Colors[0x20].y = local_2a8.y;
  pIVar1->Colors[0x20].z = local_2a8.z;
  pIVar1->Colors[0x20].w = local_2a8.w;
  ImVec4::ImVec4(&local_2b8,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x21].x = local_2b8.x;
  pIVar1->Colors[0x21].y = local_2b8.y;
  pIVar1->Colors[0x21].z = local_2b8.z;
  pIVar1->Colors[0x21].w = local_2b8.w;
  ImVec4::ImVec4(&local_2c8,local_38,fStack_34,col_text.x,0.16);
  pIVar1->Colors[0x22].x = local_2c8.x;
  pIVar1->Colors[0x22].y = local_2c8.y;
  pIVar1->Colors[0x22].z = local_2c8.z;
  pIVar1->Colors[0x22].w = local_2c8.w;
  ImVec4::ImVec4(&local_2d8,local_38,fStack_34,col_text.x,0.39);
  pIVar1->Colors[0x23].x = local_2d8.x;
  pIVar1->Colors[0x23].y = local_2d8.y;
  pIVar1->Colors[0x23].z = local_2d8.z;
  pIVar1->Colors[0x23].w = local_2d8.w;
  ImVec4::ImVec4(&local_2e8,local_38,fStack_34,col_text.x,1.0);
  pIVar1->Colors[0x24].x = local_2e8.x;
  pIVar1->Colors[0x24].y = local_2e8.y;
  pIVar1->Colors[0x24].z = local_2e8.z;
  pIVar1->Colors[0x24].w = local_2e8.w;
  ImVec4::ImVec4(&local_2f8,local_38,fStack_34,col_text.x,0.63);
  pIVar1->Colors[0x25].x = local_2f8.x;
  pIVar1->Colors[0x25].y = local_2f8.y;
  pIVar1->Colors[0x25].z = local_2f8.z;
  pIVar1->Colors[0x25].w = local_2f8.w;
  ImVec4::ImVec4(&local_308,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x26].x = local_308.x;
  pIVar1->Colors[0x26].y = local_308.y;
  pIVar1->Colors[0x26].z = local_308.z;
  pIVar1->Colors[0x26].w = local_308.w;
  ImVec4::ImVec4(&local_318,local_38,fStack_34,col_text.x,0.63);
  pIVar1->Colors[0x27].x = local_318.x;
  pIVar1->Colors[0x27].y = local_318.y;
  pIVar1->Colors[0x27].z = local_318.z;
  pIVar1->Colors[0x27].w = local_318.w;
  ImVec4::ImVec4(&local_328,local_58,fStack_54,col_main.x,1.0);
  pIVar1->Colors[0x28].x = local_328.x;
  pIVar1->Colors[0x28].y = local_328.y;
  pIVar1->Colors[0x28].z = local_328.z;
  pIVar1->Colors[0x28].w = local_328.w;
  ImVec4::ImVec4(&local_338,local_58,fStack_54,col_main.x,0.43);
  pIVar1->Colors[0x29].x = local_338.x;
  pIVar1->Colors[0x29].y = local_338.y;
  pIVar1->Colors[0x29].z = local_338.z;
  pIVar1->Colors[0x29].w = local_338.w;
  ImVec4::ImVec4(&local_348,0.2,0.2,0.2,0.35);
  pIVar1->Colors[0x2a].x = local_348.x;
  pIVar1->Colors[0x2a].y = local_348.y;
  pIVar1->Colors[0x2a].z = local_348.z;
  pIVar1->Colors[0x2a].w = local_348.w;
  return;
}

Assistant:

void SetupStyleFromHue()
{
#if 1
    // FIXME: those should become parameters to the function
    static int hue = 140;
    static float col_main_sat = 180.f/255.f;
    static float col_main_val = 161.f/255.f;
    static float col_area_sat = 124.f/255.f;
    static float col_area_val = 100.f/255.f;
    static float col_back_sat = 59.f/255.f;
    static float col_back_val = 40.f/255.f;

    ImGui::Begin("Hue Style");
    ImGui::SliderInt("master hue", &hue, 0, 255);

    float dummy;
    ImVec4 rgb;
    ImGui::ColorEditMode(ImGuiColorEditMode_HSV);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_main_sat, col_main_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("main", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_main_sat, col_main_val);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_area_sat, col_area_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("area", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_area_sat, col_area_val);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_back_sat, col_back_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("back", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_back_sat, col_back_val);

    ImGui::End();
#endif

    ImGuiStyle& style = ImGui::GetStyle();

    ImVec4 col_text = ImColor::HSV(hue/255.f,  20.f/255.f, 235.f/255.f);
    ImVec4 col_main = ImColor::HSV(hue/255.f, col_main_sat, col_main_val);
    ImVec4 col_back = ImColor::HSV(hue/255.f, col_back_sat, col_back_val);
    ImVec4 col_area = ImColor::HSV(hue/255.f, col_area_sat, col_area_val);

    style.Colors[ImGuiCol_Text]                  = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(col_text.x, col_text.y, col_text.z, 0.58f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(col_back.x, col_back.y, col_back.z, 1.00f);
    style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(col_area.x, col_area.y, col_area.z, 0.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(col_text.x, col_text.y, col_text.z, 0.30f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(col_main.x, col_main.y, col_main.z, 0.68f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(col_main.x, col_main.y, col_main.z, 0.45f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(col_main.x, col_main.y, col_main.z, 0.35f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(col_area.x, col_area.y, col_area.z, 0.57f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_ComboBg]               = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(col_main.x, col_main.y, col_main.z, 0.80f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(col_main.x, col_main.y, col_main.z, 0.24f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(col_main.x, col_main.y, col_main.z, 0.44f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.86f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(col_main.x, col_main.y, col_main.z, 0.76f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.86f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Column]                = ImVec4(col_text.x, col_text.y, col_text.z, 0.32f);
    style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(col_text.x, col_text.y, col_text.z, 0.78f);
    style.Colors[ImGuiCol_ColumnActive]          = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(col_main.x, col_main.y, col_main.z, 0.20f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_CloseButton]           = ImVec4(col_text.x, col_text.y, col_text.z, 0.16f);
    style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(col_text.x, col_text.y, col_text.z, 0.39f);
    style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(col_text.x, col_text.y, col_text.z, 0.63f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(col_text.x, col_text.y, col_text.z, 0.63f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(col_main.x, col_main.y, col_main.z, 0.43f);
    //style.Colors[ImGuiCol_TooltipBg]             = ImVec4(col_main.x, col_main.y, col_main.z, 0.92f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}